

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O3

void __thiscall
sg14::retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_>::~retain_ptr
          (retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_> *this)

{
  pointer pTVar1;
  
  pTVar1 = this->ptr;
  if (pTVar1 != (pointer)0x0) {
    LOCK();
    (pTVar1->super_atomic_reference_count<ThreadSafeBase>).count.super___atomic_base<long>._M_i =
         (pTVar1->super_atomic_reference_count<ThreadSafeBase>).count.super___atomic_base<long>._M_i
         + -1;
    UNLOCK();
    if ((pTVar1->super_atomic_reference_count<ThreadSafeBase>).count.super___atomic_base<long>._M_i
        == 0) {
      instance_counted<ThreadSafeBase>::numInstances =
           instance_counted<ThreadSafeBase>::numInstances + -1;
      operator_delete(pTVar1,8);
      return;
    }
  }
  return;
}

Assistant:

pointer get () const noexcept { return this->ptr; }